

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_applies_must(lyd_node *node)

{
  LYS_NODE LVar1;
  lys_node *node_00;
  bool bVar2;
  lys_node *local_28;
  lys_node *iter;
  lys_node *schema;
  uint8_t must_size;
  int ret;
  lyd_node *node_local;
  
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x174f,"int resolve_applies_must(const struct lyd_node *)");
  }
  node_00 = node->schema;
  LVar1 = node_00->nodetype;
  if (LVar1 == LYS_CONTAINER) {
    schema._3_1_ = node_00->padding[2];
  }
  else if (LVar1 == LYS_LEAF) {
    schema._3_1_ = node_00->padding[3];
  }
  else if (LVar1 == LYS_LEAFLIST) {
    schema._3_1_ = node_00->padding[3];
  }
  else if (LVar1 == LYS_LIST) {
    schema._3_1_ = node_00->padding[0];
  }
  else {
    if (LVar1 != LYS_ANYXML) {
      if (LVar1 == LYS_NOTIF) {
        schema._3_1_ = node_00->padding[3];
        goto LAB_0011b783;
      }
      if (LVar1 != LYS_ANYDATA) {
        schema._3_1_ = '\0';
        goto LAB_0011b783;
      }
    }
    schema._3_1_ = node_00->padding[3];
  }
LAB_0011b783:
  schema._4_4_ = (uint)(schema._3_1_ != '\0');
  if (node->prev->next == (lyd_node *)0x0) {
    local_28 = lys_parent(node_00);
    while( true ) {
      bVar2 = false;
      if (local_28 != (lys_node *)0x0) {
        bVar2 = (local_28->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN;
      }
      if (!bVar2) break;
      local_28 = lys_parent(local_28);
    }
    if ((local_28 != (lys_node *)0x0) &&
       ((local_28->nodetype & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN)) {
      schema._4_4_ = schema._4_4_ + 2;
    }
  }
  return schema._4_4_;
}

Assistant:

int
resolve_applies_must(const struct lyd_node *node)
{
    int ret = 0;
    uint8_t must_size;
    struct lys_node *schema, *iter;

    assert(node);

    schema = node->schema;

    /* their own must */
    switch (schema->nodetype) {
    case LYS_CONTAINER:
        must_size = ((struct lys_node_container *)schema)->must_size;
        break;
    case LYS_LEAF:
        must_size = ((struct lys_node_leaf *)schema)->must_size;
        break;
    case LYS_LEAFLIST:
        must_size = ((struct lys_node_leaflist *)schema)->must_size;
        break;
    case LYS_LIST:
        must_size = ((struct lys_node_list *)schema)->must_size;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        must_size = ((struct lys_node_anydata *)schema)->must_size;
        break;
    case LYS_NOTIF:
        must_size = ((struct lys_node_notif *)schema)->must_size;
        break;
    default:
        must_size = 0;
        break;
    }

    if (must_size) {
        ++ret;
    }

    /* schema may be a direct data child of input/output with must (but it must be first, it needs to be evaluated only once) */
    if (!node->prev->next) {
        for (iter = lys_parent(schema); iter && (iter->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES)); iter = lys_parent(iter));
        if (iter && (iter->nodetype & (LYS_INPUT | LYS_OUTPUT))) {
            ret += 0x2;
        }
    }

    return ret;
}